

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Root(AMFImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  CAMFImporter_NodeElement_Root *this_00;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  byte local_ba;
  allocator<char> local_b9;
  undefined1 local_b8 [6];
  bool close_found;
  undefined4 local_98;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string an;
  uint local_5c;
  int idx_end;
  int idx;
  CAMFImporter_NodeElement *ne;
  string version;
  string unit;
  AMFImporter *this_local;
  
  std::__cxx11::string::string((string *)(version.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&ne);
  _idx_end = (CAMFImporter_NodeElement_Root *)0x0;
  local_5c = 0;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  for (; (int)local_5c < iVar2; local_5c = local_5c + 1) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)local_5c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,(char *)CONCAT44(extraout_var,iVar3),&local_91);
    std::allocator<char>::~allocator(&local_91);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"unit");
    if (bVar1) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_5c);
      std::__cxx11::string::operator=
                ((string *)(version.field_2._M_local_buf + 8),
                 (char *)CONCAT44(extraout_var_00,iVar3));
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"version");
      if (bVar1) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_5c);
        std::__cxx11::string::operator=((string *)&ne,(char *)CONCAT44(extraout_var_01,iVar3));
      }
    }
    local_98 = 4;
    std::__cxx11::string::~string((string *)local_90);
  }
  uVar5 = std::__cxx11::string::empty();
  if (((((uVar5 & 1) == 0) && (bVar1 = std::operator!=(&this->mUnit,"inch"), bVar1)) &&
      (bVar1 = std::operator!=(&this->mUnit,"millimeter"), bVar1)) &&
     (((bVar1 = std::operator!=(&this->mUnit,"meter"), bVar1 &&
       (bVar1 = std::operator!=(&this->mUnit,"feet"), bVar1)) &&
      (bVar1 = std::operator!=(&this->mUnit,"micron"), bVar1)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"unit",&local_b9);
    Throw_IncorrectAttrValue(this,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  this_00 = (CAMFImporter_NodeElement_Root *)operator_new(0x90);
  CAMFImporter_NodeElement_Root::CAMFImporter_NodeElement_Root
            (this_00,(CAMFImporter_NodeElement *)0x0);
  this->mNodeElement_Cur = (CAMFImporter_NodeElement *)this_00;
  _idx_end = this_00;
  std::__cxx11::string::operator=
            ((string *)&this_00->Unit,(string *)(version.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=((string *)&_idx_end->Version,(string *)&ne);
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar4 & 1) == 0) {
    local_ba = 0;
    do {
      do {
        while( true ) {
          uVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar4 & 1) == 0) goto LAB_0043fa89;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"object",&local_e1)
          ;
          bVar1 = XML_CheckNode_NameEqual(this,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::allocator<char>::~allocator(&local_e1);
          if (bVar1) {
            ParseNode_Object(this);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,"material",&local_109);
            bVar1 = XML_CheckNode_NameEqual(this,&local_108);
            std::__cxx11::string::~string((string *)&local_108);
            std::allocator<char>::~allocator(&local_109);
            if (bVar1) {
              ParseNode_Material(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_130,"texture",&local_131);
              bVar1 = XML_CheckNode_NameEqual(this,&local_130);
              std::__cxx11::string::~string((string *)&local_130);
              std::allocator<char>::~allocator(&local_131);
              if (bVar1) {
                ParseNode_Texture(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_158,"constellation",&local_159);
                bVar1 = XML_CheckNode_NameEqual(this,&local_158);
                std::__cxx11::string::~string((string *)&local_158);
                std::allocator<char>::~allocator(&local_159);
                if (bVar1) {
                  ParseNode_Constellation(this);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_180,"metadata",&local_181);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_180);
                  std::__cxx11::string::~string((string *)&local_180);
                  std::allocator<char>::~allocator(&local_181);
                  if (bVar1) {
                    ParseNode_Metadata(this);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1a8,"amf",&local_1a9);
                    XML_CheckNode_SkipUnsupported(this,&local_1a8);
                    std::__cxx11::string::~string((string *)&local_1a8);
                    std::allocator<char>::~allocator(&local_1a9);
                  }
                }
              }
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"amf",&local_1d1);
      bVar1 = XML_CheckNode_NameEqual(this,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
    } while (!bVar1);
    local_ba = 1;
LAB_0043fa89:
    if ((local_ba & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"amf",&local_1f9);
      Throw_CloseNotFound(this,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
    }
    this->mNodeElement_Cur = &_idx_end->super_CAMFImporter_NodeElement;
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,(value_type *)&idx_end);
  std::__cxx11::string::~string((string *)&ne);
  std::__cxx11::string::~string((string *)(version.field_2._M_local_buf + 8));
  return;
}

Assistant:

void AMFImporter::ParseNode_Root()
{
    std::string unit, version;
    CAMFImporter_NodeElement *ne( nullptr );

	// Read attributes for node <amf>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("unit", unit, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("version", version, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND_WSKIP;

	// Check attributes
	if(!mUnit.empty())
	{
		if((mUnit != "inch") && (mUnit != "millimeter") && (mUnit != "meter") && (mUnit != "feet") && (mUnit != "micron")) Throw_IncorrectAttrValue("unit");
	}

	// create root node element.
	ne = new CAMFImporter_NodeElement_Root(nullptr);
	mNodeElement_Cur = ne;// set first "current" element
	// and assign attribute's values
	((CAMFImporter_NodeElement_Root*)ne)->Unit = unit;
	((CAMFImporter_NodeElement_Root*)ne)->Version = version;

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		MACRO_NODECHECK_LOOPBEGIN("amf");
			if(XML_CheckNode_NameEqual("object")) { ParseNode_Object(); continue; }
			if(XML_CheckNode_NameEqual("material")) { ParseNode_Material(); continue; }
			if(XML_CheckNode_NameEqual("texture")) { ParseNode_Texture(); continue; }
			if(XML_CheckNode_NameEqual("constellation")) { ParseNode_Constellation(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("amf");
		mNodeElement_Cur = ne;// force restore "current" element
	}// if(!mReader->isEmptyElement())

	mNodeElement_List.push_back(ne);// add to node element list because its a new object in graph.
}